

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O3

void __thiscall polyscope::Structure::setTransformUniforms(Structure *this,ShaderProgram *p)

{
  SlicePlane *this_00;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  undefined8 *puVar7;
  undefined1 *puVar8;
  vec4 vVar9;
  mat4 Pinv;
  mat4 P;
  mat4 projMat;
  mat4 viewMat;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 local_130 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_f0;
  undefined1 local_b0 [64];
  mat4 local_70;
  
  getModelView(&local_70,this);
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"u_modelView","");
  (*p->_vptr_ShaderProgram[7])(p,(string *)local_150,&local_70);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  view::getCameraPerspectiveMatrix();
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"u_projMatrix","");
  (*p->_vptr_ShaderProgram[7])(p,local_170,local_b0);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0]);
  }
  bVar4 = render::Engine::transparencyEnabled(render::engine);
  if (bVar4) {
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"u_transparency","");
    iVar5 = (*p->_vptr_ShaderProgram[2])(p,local_190);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    if ((char)iVar5 != '\0') {
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"u_transparency","");
      (*p->_vptr_ShaderProgram[5])((ulong)(uint)(this->transparency).value,p,local_1b0);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0]);
      }
    }
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"u_viewportDim","");
    iVar5 = (*p->_vptr_ShaderProgram[2])(p,local_1d0);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    if ((char)iVar5 != '\0') {
      vVar9 = render::Engine::getCurrentViewport(render::engine);
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>(vVar9._0_8_,local_1f0,"u_viewportDim","");
      (*p->_vptr_ShaderProgram[8])(vVar9._8_8_,p,local_1f0);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0]);
      }
    }
    bVar4 = render::Engine::transparencyEnabled(render::engine);
    if (bVar4) {
      local_330[0] = local_320;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"t_minDepth","");
      iVar5 = (*p->_vptr_ShaderProgram[0x15])(p,local_330);
      if ((char)iVar5 == '\0') {
        puVar8 = local_330[0];
        if (local_330[0] == local_320) goto LAB_001c196b;
      }
      else {
        local_210[0] = local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"t_minDepth","");
        iVar5 = (*p->_vptr_ShaderProgram[0x16])(p,local_210);
        if (local_210[0] != local_200) {
          operator_delete(local_210[0]);
        }
        if (local_330[0] != local_320) {
          operator_delete(local_330[0]);
        }
        if ((char)iVar5 != '\0') goto LAB_001c196b;
        local_230[0] = local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"t_minDepth","");
        (*p->_vptr_ShaderProgram[0x1a])
                  (p,local_230,
                   (render::engine->sceneDepthMin).
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        puVar8 = local_230[0];
        if (local_230[0] == local_220) goto LAB_001c196b;
      }
      operator_delete(puVar8);
    }
  }
LAB_001c196b:
  puVar3 = DAT_004badf8;
  if (state::slicePlanes != DAT_004badf8) {
    puVar7 = state::slicePlanes;
    do {
      this_00 = (SlicePlane *)*puVar7;
      pcVar1 = (this_00->name)._M_dataplus._M_p;
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_250,pcVar1,pcVar1 + (this_00->name)._M_string_length);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->ignoredSlicePlaneNames).value.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->ignoredSlicePlaneNames).value.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(string *)local_250);
      pbVar2 = (this->ignoredSlicePlaneNames).value.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_250[0] != local_240) {
        operator_delete(local_250[0]);
      }
      SlicePlane::setSceneObjectUniforms(this_00,p,_Var6._M_current != pbVar2);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"u_viewport_worldPos","");
  iVar5 = (*p->_vptr_ShaderProgram[2])(p,local_270);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0]);
  }
  if ((char)iVar5 != '\0') {
    vVar9 = render::Engine::getCurrentViewport(render::engine);
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"u_viewport_worldPos","");
    (*p->_vptr_ShaderProgram[10])(vVar9._0_8_,vVar9._8_8_,p,local_290);
    if (local_290[0] != local_280) {
      operator_delete(local_290[0]);
    }
  }
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"u_invProjMatrix_worldPos","")
  ;
  iVar5 = (*p->_vptr_ShaderProgram[2])(p,local_2b0);
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0]);
  }
  if ((char)iVar5 != '\0') {
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_f0);
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d0,"u_invProjMatrix_worldPos","");
    (*p->_vptr_ShaderProgram[7])(p,local_2d0,local_130);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
  }
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"u_invViewMatrix_worldPos","")
  ;
  iVar5 = (*p->_vptr_ShaderProgram[2])(p,local_2f0);
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0]);
  }
  if ((char)iVar5 != '\0') {
    view::getCameraViewMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_f0);
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_310,"u_invViewMatrix_worldPos","");
    (*p->_vptr_ShaderProgram[7])(p,local_310,local_130);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
  }
  return;
}

Assistant:

void Structure::setTransformUniforms(render::ShaderProgram& p) {
  glm::mat4 viewMat = getModelView();
  p.setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  p.setUniform("u_projMatrix", glm::value_ptr(projMat));

  if (render::engine->transparencyEnabled()) {
    if (p.hasUniform("u_transparency")) {
      p.setUniform("u_transparency", transparency.get());
    }

    if (p.hasUniform("u_viewportDim")) {
      glm::vec4 viewport = render::engine->getCurrentViewport();
      glm::vec2 viewportDim{viewport[2], viewport[3]};
      p.setUniform("u_viewportDim", viewportDim);
    }

    // Attach the min depth texture, if needed
    // (note that this design is somewhat lazy wrt to the name of the function: it sets a texture, not a uniform, and
    // only actually does anything once on initialization)
    if (render::engine->transparencyEnabled() && p.hasTexture("t_minDepth") && !p.textureIsSet("t_minDepth")) {
      p.setTextureFromBuffer("t_minDepth", render::engine->sceneDepthMin.get());
    }
  }

  // Respect any slice planes
  for (SlicePlane* s : state::slicePlanes) {
    bool ignoreThisPlane = getIgnoreSlicePlane(s->name);
    s->setSceneObjectUniforms(p, ignoreThisPlane);
  }

  // TODO this chain if "if"s is not great. Set up some system in the render engine to conditionally set these? Maybe
  // a list of lambdas? Ugh.
  if (p.hasUniform("u_viewport_worldPos")) {
    glm::vec4 viewport = render::engine->getCurrentViewport();
    p.setUniform("u_viewport_worldPos", viewport);
  }
  if (p.hasUniform("u_invProjMatrix_worldPos")) {
    glm::mat4 P = view::getCameraPerspectiveMatrix();
    glm::mat4 Pinv = glm::inverse(P);
    p.setUniform("u_invProjMatrix_worldPos", glm::value_ptr(Pinv));
  }
  if (p.hasUniform("u_invViewMatrix_worldPos")) {
    glm::mat4 V = view::getCameraViewMatrix();
    glm::mat4 Vinv = glm::inverse(V);
    p.setUniform("u_invViewMatrix_worldPos", glm::value_ptr(Vinv));
  }
}